

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_math.c
# Opt level: O1

size_t ares_pow(size_t x,size_t y)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (y != 0) {
    sVar2 = 1;
    do {
      sVar3 = x;
      if ((y & 1) == 0) {
        sVar3 = 1;
      }
      sVar2 = sVar2 * sVar3;
      x = x * x;
      bVar1 = 1 < y;
      y = y >> 1;
    } while (bVar1);
    return sVar2;
  }
  return 1;
}

Assistant:

size_t ares_pow(size_t x, size_t y)
{
  size_t res = 1;

  while (y > 0) {
    /* If y is odd, multiply x with result */
    if (y & 1) {
      res = res * x;
    }

    /* y must be even now */
    y = y >> 1; /* y /= 2; */
    x = x * x;  /* x^2 */
  }

  return res;
}